

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

BottomLevelASVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::BottomLevelASVkImpl,Diligent::FixedBlockMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::BottomLevelASVkImpl,Diligent::FixedBlockMemoryAllocator> *this,
          RenderDeviceVkImpl **CtorArgs,BottomLevelASDesc *CtorArgs_1,RESOURCE_STATE *CtorArgs_2,
          VkAccelerationStructureKHR_T **CtorArgs_3)

{
  RenderDeviceVkImpl **ppRVar1;
  BottomLevelASVkImpl *local_48;
  BottomLevelASVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  VkAccelerationStructureKHR_T **CtorArgs_local_3;
  RESOURCE_STATE *CtorArgs_local_2;
  BottomLevelASDesc *CtorArgs_local_1;
  RenderDeviceVkImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::BottomLevelASVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppRVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (BottomLevelASVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (BottomLevelASVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_48 = (BottomLevelASVkImpl *)
               RefCountedObject<Diligent::IBottomLevelASVk>::operator_new
                         ((RefCountedObject<Diligent::IBottomLevelASVk> *)0x120,(size_t)ppRVar1);
    BottomLevelASVkImpl::BottomLevelASVkImpl
              (local_48,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,*CtorArgs_2,*CtorArgs_3);
  }
  else {
    local_48 = (BottomLevelASVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0x120,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    BottomLevelASVkImpl::BottomLevelASVkImpl
              (local_48,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,*CtorArgs_2,*CtorArgs_3);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::BottomLevelASVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_48,*(FixedBlockMemoryAllocator **)this);
  }
  return local_48;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }